

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Mat *this_01;
  Mat *this_02;
  size_t sVar4;
  int i;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  int i_53;
  int iVar9;
  uint uVar10;
  float *pfVar11;
  long lVar12;
  void *pvVar13;
  int x_2;
  ulong uVar14;
  int x_28;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int y_14;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  float *pfVar21;
  int i_49;
  float fVar22;
  float fVar23;
  Mat local_88;
  ulong local_48;
  void *local_40;
  ulong local_38;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = this_01 + 1;
  this_02 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    uVar10 = this_01->w;
    lVar17 = (long)(int)uVar10;
    sVar4 = this_01->elemsize;
    uVar2 = this_01[1].w;
    lVar12 = (long)(int)uVar2;
    uVar3 = this_01[1].h;
    uVar15 = this_01[1].c;
    iVar9 = this_01->dims;
    if (iVar9 == 1) {
      uVar19 = uVar3 * uVar2;
      iVar9 = this_01[1].dims;
      if (uVar10 == 1) {
        if (iVar9 == 1) {
          Mat::create(this_02,uVar2,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = *(float *)((long)pvVar8 + uVar20 * 4) + fVar23;
          }
        }
        else if (iVar9 == 2) {
          Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = *(float *)((long)pvVar8 + uVar20 * 4) + fVar23;
          }
        }
        else {
          if (iVar9 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_00,uVar10);
            pvVar6 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pvVar8 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar8 + uVar20 * 4) = *(float *)((long)pvVar6 + uVar20 * 4) + fVar23
              ;
            }
          }
        }
      }
      else if (iVar9 == 1) {
        Mat::create(this_02,uVar10,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar8 = this_01->data;
          fVar23 = *this_01[1].data;
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = *(float *)((long)pvVar8 + uVar20 * 4) + fVar23;
          }
        }
        else {
          pvVar8 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar6 + uVar5 * 4) =
                 *(float *)((long)pvVar13 + uVar5 * 4) + *(float *)((long)pvVar8 + uVar5 * 4);
          }
        }
      }
      else if (iVar9 == 2) {
        Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar8 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar20 = 0;
        if (0 < (int)uVar2) {
          uVar20 = (ulong)uVar2;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)pvVar8 + uVar5 * 4);
          for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar6 + uVar7 * 4) = *(float *)((long)pvVar13 + uVar7 * 4) + fVar23;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
          pvVar13 = (void *)((long)pvVar13 + lVar12 * 4);
        }
      }
      else {
        if (iVar9 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        uVar20 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar20 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)this_01->data + uVar5 * 4);
          Mat::channel(&local_88,this_00,(int)uVar5);
          pvVar6 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,(int)uVar5);
          pvVar8 = local_88.data;
          Mat::~Mat(&local_88);
          for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar8 + uVar7 * 4) = *(float *)((long)pvVar6 + uVar7 * 4) + fVar23;
          }
        }
      }
    }
    else {
      uVar19 = this_01->h;
      uVar18 = uVar19 * uVar10;
      if (iVar9 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar20 = 0;
          if (0 < (int)uVar2) {
            uVar20 = (ulong)uVar2;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            iVar9 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar6 = this_01->data;
            Mat::channel(&local_88,this_00,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = pfVar21[uVar7] + fVar23;
              }
              pfVar11 = pfVar11 + lVar12;
              pfVar21 = pfVar21 + lVar12;
            }
          }
        }
        else {
          Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims == 1) {
            Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].w == 1) {
              pvVar8 = this_01->data;
              fVar23 = *this_01[1].data;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar6 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) + fVar23;
              }
            }
            else {
              pvVar8 = this_01->data;
              pvVar13 = this_01[1].data;
              uVar20 = 0;
              if (0 < (int)uVar10) {
                uVar20 = (ulong)uVar10;
              }
              uVar5 = (ulong)uVar19;
              if ((int)uVar19 < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar7 * 4);
                for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
                  *(float *)((long)pvVar6 + uVar14 * 4) =
                       *(float *)((long)pvVar8 + uVar14 * 4) + fVar23;
                }
                pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
                pvVar8 = (void *)((long)pvVar8 + lVar17 * 4);
              }
            }
          }
          else {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar8 = this_01->data;
            pvVar13 = this_01[1].data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar6 + uVar20 * 4) =
                   *(float *)((long)pvVar13 + uVar20 * 4) + *(float *)((long)pvVar8 + uVar20 * 4);
            }
          }
        }
      }
      else if (iVar9 == 3) {
        uVar16 = this_01->c;
        uVar20 = (ulong)uVar16;
        Mat::create(this_02,uVar10,uVar19,uVar16,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        iVar9 = this_01[1].dims;
        if (iVar9 == 1) {
          if (this_01[1].w == 1) {
            fVar23 = *this_00->data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) + fVar23;
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar20 = 0;
            }
            for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
              Mat::channel(&local_88,this_01,(int)uVar5);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              fVar23 = *(float *)((long)this_01[1].data + uVar5 * 4);
              Mat::channel(&local_88,this_02,(int)uVar5);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
                *(float *)((long)pvVar8 + uVar7 * 4) = *(float *)((long)pvVar6 + uVar7 * 4) + fVar23
                ;
              }
            }
          }
        }
        else if (iVar9 == 3) {
          if (uVar15 == uVar16 && (uVar3 == 1 && uVar2 == 1)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *pvVar13 + *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
          else if ((uVar2 == uVar10) && (uVar15 == 1 && uVar3 == uVar19)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar6 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) + *(float *)((long)pvVar8 + uVar20 * 4);
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) + *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
        }
        else {
          if (iVar9 != 2) {
            return 0;
          }
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_01,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            iVar9 = this_01[1].w;
            sVar4 = this_01[1].elemsize;
            pvVar6 = this_01[1].data;
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = pfVar21[uVar7] + fVar23;
              }
              pfVar11 = pfVar11 + lVar17;
              pfVar21 = pfVar21 + lVar17;
            }
          }
        }
      }
    }
    break;
  case 1:
    uVar10 = this_01->w;
    lVar12 = (long)(int)uVar10;
    sVar4 = this_01->elemsize;
    uVar2 = this_01[1].w;
    lVar17 = (long)(int)uVar2;
    uVar3 = this_01[1].h;
    uVar15 = this_01[1].c;
    uVar20 = (ulong)uVar15;
    iVar9 = this_01->dims;
    if (iVar9 == 1) {
      uVar19 = uVar3 * uVar2;
      iVar9 = this_01[1].dims;
      if (uVar10 == 1) {
        if (iVar9 == 1) {
          Mat::create(this_02,uVar2,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar23 - *(float *)((long)pvVar8 + uVar20 * 4);
          }
        }
        else if (iVar9 == 2) {
          Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar23 - *(float *)((long)pvVar8 + uVar20 * 4);
          }
        }
        else {
          if (iVar9 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_00,uVar10);
            pvVar6 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pvVar8 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar8 + uVar20 * 4) = fVar23 - *(float *)((long)pvVar6 + uVar20 * 4)
              ;
            }
          }
        }
      }
      else if (iVar9 == 1) {
        Mat::create(this_02,uVar10,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar8 = this_01->data;
          fVar23 = *this_01[1].data;
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = *(float *)((long)pvVar8 + uVar20 * 4) - fVar23;
          }
        }
        else {
          pvVar8 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar6 + uVar5 * 4) =
                 *(float *)((long)pvVar8 + uVar5 * 4) - *(float *)((long)pvVar13 + uVar5 * 4);
          }
        }
      }
      else if (iVar9 == 2) {
        Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar8 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar20 = 0;
        if (0 < (int)uVar2) {
          uVar20 = (ulong)uVar2;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)pvVar8 + uVar5 * 4);
          for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar6 + uVar7 * 4) = fVar23 - *(float *)((long)pvVar13 + uVar7 * 4);
          }
          pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
          pvVar13 = (void *)((long)pvVar13 + lVar17 * 4);
        }
      }
      else {
        if (iVar9 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar20 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)this_01->data + uVar5 * 4);
          Mat::channel(&local_88,this_00,(int)uVar5);
          pvVar6 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,(int)uVar5);
          pvVar8 = local_88.data;
          Mat::~Mat(&local_88);
          for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar8 + uVar7 * 4) = fVar23 - *(float *)((long)pvVar6 + uVar7 * 4);
          }
        }
      }
    }
    else {
      uVar19 = this_01->h;
      uVar18 = uVar19 * uVar10;
      if (iVar9 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar20 = 0;
          if (0 < (int)uVar2) {
            uVar20 = (ulong)uVar2;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            iVar9 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar6 = this_01->data;
            Mat::channel(&local_88,this_00,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = fVar23 - pfVar21[uVar7];
              }
              pfVar11 = pfVar11 + lVar17;
              pfVar21 = pfVar21 + lVar17;
            }
          }
        }
        else {
          Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims == 1) {
            Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].w == 1) {
              pvVar8 = this_01->data;
              fVar23 = *this_01[1].data;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar6 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) - fVar23;
              }
            }
            else {
              pvVar8 = this_01->data;
              pvVar13 = this_01[1].data;
              uVar20 = 0;
              if (0 < (int)uVar10) {
                uVar20 = (ulong)uVar10;
              }
              uVar5 = (ulong)uVar19;
              if ((int)uVar19 < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar7 * 4);
                for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
                  *(float *)((long)pvVar6 + uVar14 * 4) =
                       *(float *)((long)pvVar8 + uVar14 * 4) - fVar23;
                }
                pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
                pvVar8 = (void *)((long)pvVar8 + lVar12 * 4);
              }
            }
          }
          else {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar8 = this_01->data;
            pvVar13 = this_01[1].data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar6 + uVar20 * 4) =
                   *(float *)((long)pvVar8 + uVar20 * 4) - *(float *)((long)pvVar13 + uVar20 * 4);
            }
          }
        }
      }
      else if (iVar9 == 3) {
        uVar16 = this_01->c;
        uVar20 = (ulong)uVar16;
        Mat::create(this_02,uVar10,uVar19,uVar16,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        iVar9 = this_01[1].dims;
        if (iVar9 == 1) {
          if (this_01[1].w == 1) {
            fVar23 = *this_00->data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) - fVar23;
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar20 = 0;
            }
            for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
              Mat::channel(&local_88,this_01,(int)uVar5);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              fVar23 = *(float *)((long)this_01[1].data + uVar5 * 4);
              Mat::channel(&local_88,this_02,(int)uVar5);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
                *(float *)((long)pvVar8 + uVar7 * 4) = *(float *)((long)pvVar6 + uVar7 * 4) - fVar23
                ;
              }
            }
          }
        }
        else if (iVar9 == 3) {
          if (uVar15 == uVar16 && (uVar3 == 1 && uVar2 == 1)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) - *pvVar13;
              }
            }
          }
          else if ((uVar2 == uVar10) && (uVar15 == 1 && uVar3 == uVar19)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar6 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) - *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) - *(float *)((long)pvVar8 + uVar20 * 4);
              }
            }
          }
        }
        else {
          if (iVar9 != 2) {
            return 0;
          }
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_01,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            iVar9 = this_01[1].w;
            sVar4 = this_01[1].elemsize;
            pvVar6 = this_01[1].data;
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = pfVar21[uVar7] - fVar23;
              }
              pfVar11 = pfVar11 + lVar12;
              pfVar21 = pfVar21 + lVar12;
            }
          }
        }
      }
    }
    break;
  case 2:
    uVar10 = this_01->w;
    lVar17 = (long)(int)uVar10;
    sVar4 = this_01->elemsize;
    uVar2 = this_01[1].w;
    lVar12 = (long)(int)uVar2;
    uVar3 = this_01[1].h;
    uVar15 = this_01[1].c;
    iVar9 = this_01->dims;
    if (iVar9 == 1) {
      uVar19 = uVar3 * uVar2;
      iVar9 = this_01[1].dims;
      if (uVar10 == 1) {
        if (iVar9 == 1) {
          Mat::create(this_02,uVar2,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = *(float *)((long)pvVar8 + uVar20 * 4) * fVar23;
          }
        }
        else if (iVar9 == 2) {
          Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = *(float *)((long)pvVar8 + uVar20 * 4) * fVar23;
          }
        }
        else {
          if (iVar9 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_00,uVar10);
            pvVar6 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pvVar8 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar8 + uVar20 * 4) = *(float *)((long)pvVar6 + uVar20 * 4) * fVar23
              ;
            }
          }
        }
      }
      else if (iVar9 == 1) {
        Mat::create(this_02,uVar10,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar8 = this_01->data;
          fVar23 = *this_01[1].data;
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = *(float *)((long)pvVar8 + uVar20 * 4) * fVar23;
          }
        }
        else {
          pvVar8 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar6 + uVar5 * 4) =
                 *(float *)((long)pvVar13 + uVar5 * 4) * *(float *)((long)pvVar8 + uVar5 * 4);
          }
        }
      }
      else if (iVar9 == 2) {
        Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar8 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar20 = 0;
        if (0 < (int)uVar2) {
          uVar20 = (ulong)uVar2;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)pvVar8 + uVar5 * 4);
          for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar6 + uVar7 * 4) = *(float *)((long)pvVar13 + uVar7 * 4) * fVar23;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
          pvVar13 = (void *)((long)pvVar13 + lVar12 * 4);
        }
      }
      else {
        if (iVar9 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        uVar20 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar20 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)this_01->data + uVar5 * 4);
          Mat::channel(&local_88,this_00,(int)uVar5);
          pvVar6 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,(int)uVar5);
          pvVar8 = local_88.data;
          Mat::~Mat(&local_88);
          for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar8 + uVar7 * 4) = *(float *)((long)pvVar6 + uVar7 * 4) * fVar23;
          }
        }
      }
    }
    else {
      uVar19 = this_01->h;
      uVar18 = uVar19 * uVar10;
      if (iVar9 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar20 = 0;
          if (0 < (int)uVar2) {
            uVar20 = (ulong)uVar2;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            iVar9 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar6 = this_01->data;
            Mat::channel(&local_88,this_00,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = pfVar21[uVar7] * fVar23;
              }
              pfVar11 = pfVar11 + lVar12;
              pfVar21 = pfVar21 + lVar12;
            }
          }
        }
        else {
          Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims == 1) {
            Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].w == 1) {
              pvVar8 = this_01->data;
              fVar23 = *this_01[1].data;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar6 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) * fVar23;
              }
            }
            else {
              pvVar8 = this_01->data;
              pvVar13 = this_01[1].data;
              uVar20 = 0;
              if (0 < (int)uVar10) {
                uVar20 = (ulong)uVar10;
              }
              uVar5 = (ulong)uVar19;
              if ((int)uVar19 < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar7 * 4);
                for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
                  *(float *)((long)pvVar6 + uVar14 * 4) =
                       *(float *)((long)pvVar8 + uVar14 * 4) * fVar23;
                }
                pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
                pvVar8 = (void *)((long)pvVar8 + lVar17 * 4);
              }
            }
          }
          else {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar8 = this_01->data;
            pvVar13 = this_01[1].data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar6 + uVar20 * 4) =
                   *(float *)((long)pvVar13 + uVar20 * 4) * *(float *)((long)pvVar8 + uVar20 * 4);
            }
          }
        }
      }
      else if (iVar9 == 3) {
        uVar16 = this_01->c;
        uVar20 = (ulong)uVar16;
        Mat::create(this_02,uVar10,uVar19,uVar16,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        iVar9 = this_01[1].dims;
        if (iVar9 == 1) {
          if (this_01[1].w == 1) {
            fVar23 = *this_00->data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) * fVar23;
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar20 = 0;
            }
            for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
              Mat::channel(&local_88,this_01,(int)uVar5);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              fVar23 = *(float *)((long)this_01[1].data + uVar5 * 4);
              Mat::channel(&local_88,this_02,(int)uVar5);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
                *(float *)((long)pvVar8 + uVar7 * 4) = *(float *)((long)pvVar6 + uVar7 * 4) * fVar23
                ;
              }
            }
          }
        }
        else if (iVar9 == 3) {
          if (uVar15 == uVar16 && (uVar3 == 1 && uVar2 == 1)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *pvVar13 * *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
          else if ((uVar2 == uVar10) && (uVar15 == 1 && uVar3 == uVar19)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar6 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) * *(float *)((long)pvVar8 + uVar20 * 4);
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) * *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
        }
        else {
          if (iVar9 != 2) {
            return 0;
          }
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_01,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            iVar9 = this_01[1].w;
            sVar4 = this_01[1].elemsize;
            pvVar6 = this_01[1].data;
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = pfVar21[uVar7] * fVar23;
              }
              pfVar11 = pfVar11 + lVar17;
              pfVar21 = pfVar21 + lVar17;
            }
          }
        }
      }
    }
    break;
  case 3:
    uVar10 = this_01->w;
    lVar12 = (long)(int)uVar10;
    sVar4 = this_01->elemsize;
    uVar2 = this_01[1].w;
    lVar17 = (long)(int)uVar2;
    uVar3 = this_01[1].h;
    uVar15 = this_01[1].c;
    uVar20 = (ulong)uVar15;
    iVar9 = this_01->dims;
    if (iVar9 == 1) {
      uVar19 = uVar3 * uVar2;
      iVar9 = this_01[1].dims;
      if (uVar10 == 1) {
        if (iVar9 == 1) {
          Mat::create(this_02,uVar2,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar23 / *(float *)((long)pvVar8 + uVar20 * 4);
          }
        }
        else if (iVar9 == 2) {
          Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar23 / *(float *)((long)pvVar8 + uVar20 * 4);
          }
        }
        else {
          if (iVar9 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_00,uVar10);
            pvVar6 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pvVar8 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar8 + uVar20 * 4) = fVar23 / *(float *)((long)pvVar6 + uVar20 * 4)
              ;
            }
          }
        }
      }
      else if (iVar9 == 1) {
        Mat::create(this_02,uVar10,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar8 = this_01->data;
          uVar20 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar20 = 0;
          }
          fVar23 = *this_01[1].data;
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar6 + uVar5 * 4) =
                 *(float *)((long)pvVar8 + uVar5 * 4) * (1.0 / fVar23);
          }
        }
        else {
          pvVar8 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar6 + uVar5 * 4) =
                 *(float *)((long)pvVar8 + uVar5 * 4) / *(float *)((long)pvVar13 + uVar5 * 4);
          }
        }
      }
      else if (iVar9 == 2) {
        Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar8 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar20 = 0;
        if (0 < (int)uVar2) {
          uVar20 = (ulong)uVar2;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)pvVar8 + uVar5 * 4);
          for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar6 + uVar7 * 4) = fVar23 / *(float *)((long)pvVar13 + uVar7 * 4);
          }
          pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
          pvVar13 = (void *)((long)pvVar13 + lVar17 * 4);
        }
      }
      else {
        if (iVar9 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar20 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)this_01->data + uVar5 * 4);
          Mat::channel(&local_88,this_00,(int)uVar5);
          pvVar6 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,(int)uVar5);
          pvVar8 = local_88.data;
          Mat::~Mat(&local_88);
          for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar8 + uVar7 * 4) = fVar23 / *(float *)((long)pvVar6 + uVar7 * 4);
          }
        }
      }
    }
    else {
      uVar19 = this_01->h;
      uVar18 = uVar19 * uVar10;
      if (iVar9 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar20 = 0;
          if (0 < (int)uVar2) {
            uVar20 = (ulong)uVar2;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            iVar9 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar6 = this_01->data;
            Mat::channel(&local_88,this_00,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = fVar23 / pfVar21[uVar7];
              }
              pfVar11 = pfVar11 + lVar17;
              pfVar21 = pfVar21 + lVar17;
            }
          }
        }
        else {
          Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims == 1) {
            Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].w == 1) {
              pvVar8 = this_01->data;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
              fVar23 = *this_01[1].data;
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar6 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) * (1.0 / fVar23);
              }
            }
            else {
              uVar20 = 0;
              if (0 < (int)uVar10) {
                uVar20 = (ulong)uVar10;
              }
              pvVar8 = this_01->data;
              uVar5 = (ulong)uVar19;
              if ((int)uVar19 < 1) {
                uVar5 = 0;
              }
              pvVar13 = this_01[1].data;
              for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar7 * 4);
                for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
                  *(float *)((long)pvVar6 + uVar14 * 4) =
                       *(float *)((long)pvVar8 + uVar14 * 4) * (1.0 / fVar23);
                }
                pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
                pvVar8 = (void *)((long)pvVar8 + lVar12 * 4);
              }
            }
          }
          else {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar8 = this_01->data;
            pvVar13 = this_01[1].data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar6 + uVar20 * 4) =
                   *(float *)((long)pvVar8 + uVar20 * 4) / *(float *)((long)pvVar13 + uVar20 * 4);
            }
          }
        }
      }
      else if (iVar9 == 3) {
        uVar16 = this_01->c;
        uVar20 = (ulong)uVar16;
        Mat::create(this_02,uVar10,uVar19,uVar16,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        iVar9 = this_01[1].dims;
        if (iVar9 == 1) {
          if (this_01[1].w == 1) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            fVar23 = *this_00->data;
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) * (1.0 / fVar23);
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar20 = 0;
            }
            for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
              Mat::channel(&local_88,this_01,(int)uVar5);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              fVar23 = *(float *)((long)this_01[1].data + uVar5 * 4);
              Mat::channel(&local_88,this_02,(int)uVar5);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
                *(float *)((long)pvVar8 + uVar7 * 4) =
                     *(float *)((long)pvVar6 + uVar7 * 4) * (1.0 / fVar23);
              }
            }
          }
        }
        else if (iVar9 == 3) {
          if (uVar15 == uVar16 && (uVar3 == 1 && uVar2 == 1)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) / *pvVar13;
              }
            }
          }
          else if ((uVar2 == uVar10) && (uVar15 == 1 && uVar3 == uVar19)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar6 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) / *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) / *(float *)((long)pvVar8 + uVar20 * 4);
              }
            }
          }
        }
        else {
          if (iVar9 != 2) {
            return 0;
          }
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_01,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            iVar9 = this_01[1].w;
            sVar4 = this_01[1].elemsize;
            pvVar6 = this_01[1].data;
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = pfVar21[uVar7] * (1.0 / fVar23);
              }
              pfVar11 = pfVar11 + lVar12;
              pfVar21 = pfVar21 + lVar12;
            }
          }
        }
      }
    }
    break;
  case 4:
    uVar10 = this_01->w;
    lVar17 = (long)(int)uVar10;
    sVar4 = this_01->elemsize;
    uVar2 = this_01[1].w;
    lVar12 = (long)(int)uVar2;
    uVar3 = this_01[1].h;
    uVar15 = this_01[1].c;
    iVar9 = this_01->dims;
    if (iVar9 == 1) {
      uVar19 = uVar3 * uVar2;
      iVar9 = this_01[1].dims;
      if (uVar10 == 1) {
        if (iVar9 == 1) {
          Mat::create(this_02,uVar2,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
            if (fVar22 <= fVar23) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
          }
        }
        else if (iVar9 == 2) {
          Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
            if (fVar22 <= fVar23) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
          }
        }
        else {
          if (iVar9 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_00,uVar10);
            pvVar6 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pvVar8 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
              fVar22 = *(float *)((long)pvVar6 + uVar20 * 4);
              if (*(float *)((long)pvVar6 + uVar20 * 4) <= fVar23) {
                fVar22 = fVar23;
              }
              *(float *)((long)pvVar8 + uVar20 * 4) = fVar22;
            }
          }
        }
      }
      else if (iVar9 == 1) {
        Mat::create(this_02,uVar10,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar8 = this_01->data;
          fVar23 = *this_01[1].data;
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
            if (fVar22 <= fVar23) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
          }
        }
        else {
          pvVar8 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            fVar23 = *(float *)((long)pvVar13 + uVar5 * 4);
            fVar22 = *(float *)((long)pvVar8 + uVar5 * 4);
            if (fVar23 <= fVar22) {
              fVar23 = fVar22;
            }
            *(float *)((long)pvVar6 + uVar5 * 4) = fVar23;
          }
        }
      }
      else if (iVar9 == 2) {
        Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar8 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar20 = 0;
        if (0 < (int)uVar2) {
          uVar20 = (ulong)uVar2;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)pvVar8 + uVar5 * 4);
          for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
            fVar22 = *(float *)((long)pvVar13 + uVar7 * 4);
            if (fVar22 <= fVar23) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar6 + uVar7 * 4) = fVar22;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
          pvVar13 = (void *)((long)pvVar13 + lVar12 * 4);
        }
      }
      else {
        if (iVar9 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        uVar20 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar20 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)this_01->data + uVar5 * 4);
          Mat::channel(&local_88,this_00,(int)uVar5);
          pvVar6 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,(int)uVar5);
          pvVar8 = local_88.data;
          Mat::~Mat(&local_88);
          for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
            fVar22 = *(float *)((long)pvVar6 + uVar7 * 4);
            if (*(float *)((long)pvVar6 + uVar7 * 4) <= fVar23) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar8 + uVar7 * 4) = fVar22;
          }
        }
      }
    }
    else {
      uVar19 = this_01->h;
      uVar18 = uVar19 * uVar10;
      if (iVar9 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar20 = 0;
          if (0 < (int)uVar2) {
            uVar20 = (ulong)uVar2;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            iVar9 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar6 = this_01->data;
            Mat::channel(&local_88,this_00,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                fVar22 = pfVar21[uVar7];
                if (pfVar21[uVar7] <= fVar23) {
                  fVar22 = fVar23;
                }
                pfVar11[uVar7] = fVar22;
              }
              pfVar11 = pfVar11 + lVar12;
              pfVar21 = pfVar21 + lVar12;
            }
          }
        }
        else {
          Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims == 1) {
            Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].w == 1) {
              pvVar8 = this_01->data;
              fVar23 = *this_01[1].data;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
                if (fVar22 <= fVar23) {
                  fVar22 = fVar23;
                }
                *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
              }
            }
            else {
              pvVar8 = this_01->data;
              pvVar13 = this_01[1].data;
              uVar20 = 0;
              if (0 < (int)uVar10) {
                uVar20 = (ulong)uVar10;
              }
              uVar5 = (ulong)uVar19;
              if ((int)uVar19 < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar7 * 4);
                for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
                  fVar22 = *(float *)((long)pvVar8 + uVar14 * 4);
                  if (fVar22 <= fVar23) {
                    fVar22 = fVar23;
                  }
                  *(float *)((long)pvVar6 + uVar14 * 4) = fVar22;
                }
                pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
                pvVar8 = (void *)((long)pvVar8 + lVar17 * 4);
              }
            }
          }
          else {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar8 = this_01->data;
            pvVar13 = this_01[1].data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              fVar23 = *(float *)((long)pvVar13 + uVar20 * 4);
              fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
              if (fVar23 <= fVar22) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar6 + uVar20 * 4) = fVar23;
            }
          }
        }
      }
      else if (iVar9 == 3) {
        uVar16 = this_01->c;
        uVar20 = (ulong)uVar16;
        Mat::create(this_02,uVar10,uVar19,uVar16,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        iVar9 = this_01[1].dims;
        if (iVar9 == 1) {
          if (this_01[1].w == 1) {
            fVar23 = *this_00->data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar22 = *(float *)((long)pvVar6 + uVar20 * 4);
                if (*(float *)((long)pvVar6 + uVar20 * 4) <= fVar23) {
                  fVar22 = fVar23;
                }
                *(float *)((long)pvVar8 + uVar20 * 4) = fVar22;
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar20 = 0;
            }
            for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
              Mat::channel(&local_88,this_01,(int)uVar5);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              fVar23 = *(float *)((long)this_01[1].data + uVar5 * 4);
              Mat::channel(&local_88,this_02,(int)uVar5);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
                fVar22 = *(float *)((long)pvVar6 + uVar7 * 4);
                if (*(float *)((long)pvVar6 + uVar7 * 4) <= fVar23) {
                  fVar22 = fVar23;
                }
                *(float *)((long)pvVar8 + uVar7 * 4) = fVar22;
              }
            }
          }
        }
        else if (iVar9 == 3) {
          if (uVar15 == uVar16 && (uVar3 == 1 && uVar2 == 1)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar23 = *pvVar13;
                if (*pvVar13 <= *(float *)((long)pvVar6 + uVar20 * 4)) {
                  fVar23 = *(float *)((long)pvVar6 + uVar20 * 4);
                }
                *(float *)((long)pvVar8 + uVar20 * 4) = fVar23;
              }
            }
          }
          else if ((uVar2 == uVar10) && (uVar15 == 1 && uVar3 == uVar19)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar6 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar23 = *(float *)((long)pvVar6 + uVar20 * 4);
                if (fVar23 <= *(float *)((long)pvVar8 + uVar20 * 4)) {
                  fVar23 = *(float *)((long)pvVar8 + uVar20 * 4);
                }
                *(float *)((long)pvVar13 + uVar20 * 4) = fVar23;
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar23 = *(float *)((long)pvVar8 + uVar20 * 4);
                if (*(float *)((long)pvVar8 + uVar20 * 4) <= *(float *)((long)pvVar6 + uVar20 * 4))
                {
                  fVar23 = *(float *)((long)pvVar6 + uVar20 * 4);
                }
                *(float *)((long)pvVar13 + uVar20 * 4) = fVar23;
              }
            }
          }
        }
        else {
          if (iVar9 != 2) {
            return 0;
          }
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_01,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            iVar9 = this_01[1].w;
            sVar4 = this_01[1].elemsize;
            pvVar6 = this_01[1].data;
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                fVar22 = pfVar21[uVar7];
                if (pfVar21[uVar7] <= fVar23) {
                  fVar22 = fVar23;
                }
                pfVar11[uVar7] = fVar22;
              }
              pfVar11 = pfVar11 + lVar17;
              pfVar21 = pfVar21 + lVar17;
            }
          }
        }
      }
    }
    break;
  case 5:
    uVar10 = this_01->w;
    lVar17 = (long)(int)uVar10;
    sVar4 = this_01->elemsize;
    uVar2 = this_01[1].w;
    lVar12 = (long)(int)uVar2;
    uVar3 = this_01[1].h;
    uVar15 = this_01[1].c;
    uVar20 = (ulong)uVar15;
    iVar9 = this_01->dims;
    if (iVar9 == 1) {
      uVar19 = uVar3 * uVar2;
      iVar9 = this_01[1].dims;
      if (uVar10 == 1) {
        if (iVar9 == 1) {
          Mat::create(this_02,uVar2,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
            if (fVar23 <= fVar22) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
          }
        }
        else if (iVar9 == 2) {
          Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
            if (fVar23 <= fVar22) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
          }
        }
        else {
          if (iVar9 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_00,uVar10);
            pvVar6 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pvVar8 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
              fVar22 = *(float *)((long)pvVar6 + uVar20 * 4);
              if (fVar23 <= *(float *)((long)pvVar6 + uVar20 * 4)) {
                fVar22 = fVar23;
              }
              *(float *)((long)pvVar8 + uVar20 * 4) = fVar22;
            }
          }
        }
      }
      else if (iVar9 == 1) {
        Mat::create(this_02,uVar10,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar8 = this_01->data;
          fVar23 = *this_01[1].data;
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
            if (fVar23 <= fVar22) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
          }
        }
        else {
          pvVar8 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            fVar23 = *(float *)((long)pvVar13 + uVar5 * 4);
            fVar22 = *(float *)((long)pvVar8 + uVar5 * 4);
            if (fVar22 <= fVar23) {
              fVar23 = fVar22;
            }
            *(float *)((long)pvVar6 + uVar5 * 4) = fVar23;
          }
        }
      }
      else if (iVar9 == 2) {
        Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar8 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar20 = 0;
        if (0 < (int)uVar2) {
          uVar20 = (ulong)uVar2;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)pvVar8 + uVar5 * 4);
          for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
            fVar22 = *(float *)((long)pvVar13 + uVar7 * 4);
            if (fVar23 <= fVar22) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar6 + uVar7 * 4) = fVar22;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
          pvVar13 = (void *)((long)pvVar13 + lVar12 * 4);
        }
      }
      else {
        if (iVar9 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar20 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)this_01->data + uVar5 * 4);
          Mat::channel(&local_88,this_00,(int)uVar5);
          pvVar6 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,(int)uVar5);
          pvVar8 = local_88.data;
          Mat::~Mat(&local_88);
          for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
            fVar22 = *(float *)((long)pvVar6 + uVar7 * 4);
            if (fVar23 <= *(float *)((long)pvVar6 + uVar7 * 4)) {
              fVar22 = fVar23;
            }
            *(float *)((long)pvVar8 + uVar7 * 4) = fVar22;
          }
        }
      }
    }
    else {
      uVar19 = this_01->h;
      uVar18 = uVar19 * uVar10;
      if (iVar9 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar20 = 0;
          if (0 < (int)uVar2) {
            uVar20 = (ulong)uVar2;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            iVar9 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar6 = this_01->data;
            Mat::channel(&local_88,this_00,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                fVar22 = pfVar21[uVar7];
                if (fVar23 <= pfVar21[uVar7]) {
                  fVar22 = fVar23;
                }
                pfVar11[uVar7] = fVar22;
              }
              pfVar11 = pfVar11 + lVar12;
              pfVar21 = pfVar21 + lVar12;
            }
          }
        }
        else {
          Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims == 1) {
            Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].w == 1) {
              pvVar8 = this_01->data;
              fVar23 = *this_01[1].data;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
                if (fVar23 <= fVar22) {
                  fVar22 = fVar23;
                }
                *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
              }
            }
            else {
              pvVar8 = this_01->data;
              pvVar13 = this_01[1].data;
              uVar20 = 0;
              if (0 < (int)uVar10) {
                uVar20 = (ulong)uVar10;
              }
              uVar5 = (ulong)uVar19;
              if ((int)uVar19 < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar7 * 4);
                for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
                  fVar22 = *(float *)((long)pvVar8 + uVar14 * 4);
                  if (fVar23 <= fVar22) {
                    fVar22 = fVar23;
                  }
                  *(float *)((long)pvVar6 + uVar14 * 4) = fVar22;
                }
                pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
                pvVar8 = (void *)((long)pvVar8 + lVar17 * 4);
              }
            }
          }
          else {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar8 = this_01->data;
            pvVar13 = this_01[1].data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              fVar23 = *(float *)((long)pvVar13 + uVar20 * 4);
              fVar22 = *(float *)((long)pvVar8 + uVar20 * 4);
              if (fVar22 <= fVar23) {
                fVar23 = fVar22;
              }
              *(float *)((long)pvVar6 + uVar20 * 4) = fVar23;
            }
          }
        }
      }
      else if (iVar9 == 3) {
        uVar16 = this_01->c;
        uVar20 = (ulong)uVar16;
        Mat::create(this_02,uVar10,uVar19,uVar16,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        iVar9 = this_01[1].dims;
        if (iVar9 == 1) {
          if (this_01[1].w == 1) {
            fVar23 = *this_00->data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar22 = *(float *)((long)pvVar6 + uVar20 * 4);
                if (fVar23 <= *(float *)((long)pvVar6 + uVar20 * 4)) {
                  fVar22 = fVar23;
                }
                *(float *)((long)pvVar8 + uVar20 * 4) = fVar22;
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar20 = 0;
            }
            for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
              Mat::channel(&local_88,this_01,(int)uVar5);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              fVar23 = *(float *)((long)this_01[1].data + uVar5 * 4);
              Mat::channel(&local_88,this_02,(int)uVar5);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
                fVar22 = *(float *)((long)pvVar6 + uVar7 * 4);
                if (fVar23 <= *(float *)((long)pvVar6 + uVar7 * 4)) {
                  fVar22 = fVar23;
                }
                *(float *)((long)pvVar8 + uVar7 * 4) = fVar22;
              }
            }
          }
        }
        else if (iVar9 == 3) {
          if (uVar15 == uVar16 && (uVar3 == 1 && uVar2 == 1)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar23 = *pvVar13;
                if (*(float *)((long)pvVar6 + uVar20 * 4) <= *pvVar13) {
                  fVar23 = *(float *)((long)pvVar6 + uVar20 * 4);
                }
                *(float *)((long)pvVar8 + uVar20 * 4) = fVar23;
              }
            }
          }
          else if ((uVar2 == uVar10) && (uVar15 == 1 && uVar3 == uVar19)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar6 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar23 = *(float *)((long)pvVar6 + uVar20 * 4);
                if (*(float *)((long)pvVar8 + uVar20 * 4) <= fVar23) {
                  fVar23 = *(float *)((long)pvVar8 + uVar20 * 4);
                }
                *(float *)((long)pvVar13 + uVar20 * 4) = fVar23;
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar23 = *(float *)((long)pvVar8 + uVar20 * 4);
                if (*(float *)((long)pvVar6 + uVar20 * 4) <= *(float *)((long)pvVar8 + uVar20 * 4))
                {
                  fVar23 = *(float *)((long)pvVar6 + uVar20 * 4);
                }
                *(float *)((long)pvVar13 + uVar20 * 4) = fVar23;
              }
            }
          }
        }
        else {
          if (iVar9 != 2) {
            return 0;
          }
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_01,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            iVar9 = this_01[1].w;
            sVar4 = this_01[1].elemsize;
            pvVar6 = this_01[1].data;
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                fVar22 = pfVar21[uVar7];
                if (fVar23 <= pfVar21[uVar7]) {
                  fVar22 = fVar23;
                }
                pfVar11[uVar7] = fVar22;
              }
              pfVar11 = pfVar11 + lVar17;
              pfVar21 = pfVar21 + lVar17;
            }
          }
        }
      }
    }
    break;
  case 6:
    uVar10 = this_01->w;
    sVar4 = this_01->elemsize;
    uVar2 = this_01[1].w;
    lVar12 = (long)(int)uVar2;
    uVar3 = this_01[1].h;
    uVar15 = this_01[1].c;
    iVar9 = this_01->dims;
    if (iVar9 == 1) {
      uVar19 = uVar3 * uVar2;
      iVar9 = this_01[1].dims;
      if (uVar10 == 1) {
        if (iVar9 == 1) {
          Mat::create(this_02,uVar2,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = powf(fVar23,*(float *)((long)pvVar8 + uVar20 * 4));
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
          }
        }
        else if (iVar9 == 2) {
          Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            fVar22 = powf(fVar23,*(float *)((long)pvVar8 + uVar20 * 4));
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
          }
        }
        else {
          if (iVar9 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          local_38 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            local_38 = 0;
          }
          for (iVar9 = 0; iVar9 != (int)local_38; iVar9 = iVar9 + 1) {
            Mat::channel(&local_88,this_00,iVar9);
            pvVar6 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,iVar9);
            pvVar8 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
              fVar22 = powf(fVar23,*(float *)((long)pvVar6 + uVar20 * 4));
              *(float *)((long)pvVar8 + uVar20 * 4) = fVar22;
            }
          }
        }
      }
      else if (iVar9 == 1) {
        Mat::create(this_02,uVar10,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar8 = this_01->data;
          fVar23 = *this_01[1].data;
          uVar20 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar20 = 0;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            fVar22 = powf(*(float *)((long)pvVar8 + uVar5 * 4),fVar23);
            *(float *)((long)pvVar6 + uVar5 * 4) = fVar22;
          }
        }
        else {
          pvVar8 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            fVar23 = powf(*(float *)((long)pvVar8 + uVar5 * 4),*(float *)((long)pvVar13 + uVar5 * 4)
                         );
            *(float *)((long)pvVar6 + uVar5 * 4) = fVar23;
          }
        }
      }
      else if (iVar9 == 2) {
        Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar8 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar20 = 0;
        if (0 < (int)uVar2) {
          uVar20 = (ulong)uVar2;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)pvVar8 + uVar5 * 4);
          for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
            fVar22 = powf(fVar23,*(float *)((long)pvVar13 + uVar7 * 4));
            *(float *)((long)pvVar6 + uVar7 * 4) = fVar22;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
          pvVar13 = (void *)((long)pvVar13 + lVar12 * 4);
        }
      }
      else {
        if (iVar9 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        local_38 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          local_38 = 0;
        }
        for (uVar20 = 0; uVar20 != local_38; uVar20 = uVar20 + 1) {
          fVar23 = *(float *)((long)this_01->data + uVar20 * 4);
          Mat::channel(&local_88,this_00,(int)uVar20);
          pvVar6 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,(int)uVar20);
          pvVar8 = local_88.data;
          Mat::~Mat(&local_88);
          for (uVar5 = 0; uVar19 != uVar5; uVar5 = uVar5 + 1) {
            fVar22 = powf(fVar23,*(float *)((long)pvVar6 + uVar5 * 4));
            *(float *)((long)pvVar8 + uVar5 * 4) = fVar22;
          }
        }
      }
    }
    else {
      uVar19 = this_01->h;
      uVar18 = uVar19 * uVar10;
      if (iVar9 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar20 = 0;
          if (0 < (int)uVar2) {
            uVar20 = (ulong)uVar2;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          local_38 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            local_38 = 0;
          }
          iVar9 = 0;
          while (iVar9 != (int)local_38) {
            local_40 = (void *)((long)iVar9 * (long)this_01->w * this_01->elemsize +
                               (long)this_01->data);
            Mat::channel(&local_88,this_00,iVar9);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            local_48 = CONCAT44(local_48._4_4_,iVar9);
            Mat::channel(&local_88,this_02,iVar9);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)local_40 + uVar5 * 4);
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                fVar22 = powf(fVar23,pfVar21[uVar7]);
                pfVar11[uVar7] = fVar22;
              }
              pfVar11 = pfVar11 + lVar12;
              pfVar21 = pfVar21 + lVar12;
            }
            iVar9 = (int)local_48 + 1;
          }
        }
        else {
          Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims == 1) {
            Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].w == 1) {
              pvVar8 = this_01->data;
              fVar23 = *this_01[1].data;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar22 = powf(*(float *)((long)pvVar8 + uVar20 * 4),fVar23);
                *(float *)((long)pvVar6 + uVar20 * 4) = fVar22;
              }
            }
            else {
              pvVar8 = this_01->data;
              pvVar13 = this_01[1].data;
              uVar20 = 0;
              if (0 < (int)uVar10) {
                uVar20 = (ulong)uVar10;
              }
              if ((int)uVar19 < 1) {
                uVar19 = 0;
              }
              lVar12 = (long)(int)uVar10 * 4;
              for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar5 * 4);
                for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                  fVar22 = powf(*(float *)((long)pvVar8 + uVar7 * 4),fVar23);
                  *(float *)((long)pvVar6 + uVar7 * 4) = fVar22;
                }
                pvVar6 = (void *)((long)pvVar6 + lVar12);
                pvVar8 = (void *)((long)pvVar8 + lVar12);
              }
            }
          }
          else {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar8 = this_01->data;
            pvVar13 = this_01[1].data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              fVar23 = powf(*(float *)((long)pvVar8 + uVar20 * 4),
                            *(float *)((long)pvVar13 + uVar20 * 4));
              *(float *)((long)pvVar6 + uVar20 * 4) = fVar23;
            }
          }
        }
      }
      else if (iVar9 == 3) {
        uVar16 = this_01->c;
        local_40 = (void *)(long)(int)uVar10;
        Mat::create(this_02,uVar10,uVar19,uVar16,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        iVar9 = this_01[1].dims;
        if (iVar9 == 1) {
          if (this_01[1].w == 1) {
            fVar23 = *this_00->data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar22 = powf(*(float *)((long)pvVar6 + uVar20 * 4),fVar23);
                *(float *)((long)pvVar8 + uVar20 * 4) = fVar22;
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar20 = 0; uVar20 != uVar16; uVar20 = uVar20 + 1) {
              Mat::channel(&local_88,this_01,(int)uVar20);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              fVar23 = *(float *)((long)this_01[1].data + uVar20 * 4);
              Mat::channel(&local_88,this_02,(int)uVar20);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar5 = 0; uVar18 != uVar5; uVar5 = uVar5 + 1) {
                fVar22 = powf(*(float *)((long)pvVar6 + uVar5 * 4),fVar23);
                *(float *)((long)pvVar8 + uVar5 * 4) = fVar22;
              }
            }
          }
        }
        else if (iVar9 == 3) {
          if (uVar15 == uVar16 && (uVar3 == 1 && uVar2 == 1)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            local_48 = (ulong)uVar16;
            for (iVar9 = 0; iVar9 != (int)local_48; iVar9 = iVar9 + 1) {
              Mat::channel(&local_88,this_01,iVar9);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,iVar9);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,iVar9);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar23 = powf(*(float *)((long)pvVar6 + uVar20 * 4),*pvVar13);
                *(float *)((long)pvVar8 + uVar20 * 4) = fVar23;
              }
            }
          }
          else if ((uVar2 == (uint)local_40) && (uVar15 == 1 && uVar3 == uVar19)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            local_48 = (ulong)uVar16;
            for (iVar9 = 0; iVar9 != (int)local_48; iVar9 = iVar9 + 1) {
              Mat::channel(&local_88,this_01,iVar9);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar6 = this_01[1].data;
              Mat::channel(&local_88,this_02,iVar9);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar23 = powf(*(float *)((long)pvVar8 + uVar20 * 4),
                              *(float *)((long)pvVar6 + uVar20 * 4));
                *(float *)((long)pvVar13 + uVar20 * 4) = fVar23;
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            local_48 = (ulong)uVar16;
            for (iVar9 = 0; iVar9 != (int)local_48; iVar9 = iVar9 + 1) {
              Mat::channel(&local_88,this_01,iVar9);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,iVar9);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,iVar9);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                fVar23 = powf(*(float *)((long)pvVar6 + uVar20 * 4),
                              *(float *)((long)pvVar8 + uVar20 * 4));
                *(float *)((long)pvVar13 + uVar20 * 4) = fVar23;
              }
            }
          }
        }
        else {
          if (iVar9 != 2) {
            return 0;
          }
          uVar20 = 0;
          if (0 < (int)(uint)local_40) {
            uVar20 = (ulong)local_40 & 0xffffffff;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          local_48 = (ulong)uVar16;
          local_40 = (void *)((long)local_40 << 2);
          for (iVar9 = 0; iVar9 != (int)local_48; iVar9 = iVar9 + 1) {
            Mat::channel(&local_88,this_01,iVar9);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            iVar1 = this_01[1].w;
            sVar4 = this_01[1].elemsize;
            pvVar6 = this_01[1].data;
            Mat::channel(&local_88,this_02,iVar9);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)iVar9 * (long)iVar1 * sVar4);
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                fVar22 = powf(pfVar21[uVar7],fVar23);
                pfVar11[uVar7] = fVar22;
              }
              pfVar11 = (float *)((long)pfVar11 + (long)local_40);
              pfVar21 = (float *)((long)pfVar21 + (long)local_40);
            }
          }
        }
      }
    }
    break;
  case 7:
    uVar10 = this_01->w;
    lVar17 = (long)(int)uVar10;
    sVar4 = this_01->elemsize;
    uVar2 = this_01[1].w;
    lVar12 = (long)(int)uVar2;
    uVar3 = this_01[1].h;
    uVar15 = this_01[1].c;
    uVar20 = (ulong)uVar15;
    iVar9 = this_01->dims;
    if (iVar9 == 1) {
      uVar19 = uVar3 * uVar2;
      iVar9 = this_01[1].dims;
      if (uVar10 == 1) {
        if (iVar9 == 1) {
          Mat::create(this_02,uVar2,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar2 < 1) {
            uVar2 = 0;
          }
          for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = *(float *)((long)pvVar8 + uVar20 * 4) - fVar23;
          }
        }
        else if (iVar9 == 2) {
          Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = *(float *)((long)pvVar8 + uVar20 * 4) - fVar23;
          }
        }
        else {
          if (iVar9 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          fVar23 = *this_01->data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_00,uVar10);
            pvVar6 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pvVar8 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar8 + uVar20 * 4) = *(float *)((long)pvVar6 + uVar20 * 4) - fVar23
              ;
            }
          }
        }
      }
      else if (iVar9 == 1) {
        Mat::create(this_02,uVar10,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar8 = this_01->data;
          fVar23 = *this_01[1].data;
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar23 - *(float *)((long)pvVar8 + uVar20 * 4);
          }
        }
        else {
          pvVar8 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar6 + uVar5 * 4) =
                 *(float *)((long)pvVar13 + uVar5 * 4) - *(float *)((long)pvVar8 + uVar5 * 4);
          }
        }
      }
      else if (iVar9 == 2) {
        Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        pvVar8 = this_01->data;
        pvVar13 = this_01[1].data;
        uVar20 = 0;
        if (0 < (int)uVar2) {
          uVar20 = (ulong)uVar2;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)pvVar8 + uVar5 * 4);
          for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar6 + uVar7 * 4) = *(float *)((long)pvVar13 + uVar7 * 4) - fVar23;
          }
          pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
          pvVar13 = (void *)((long)pvVar13 + lVar12 * 4);
        }
      }
      else {
        if (iVar9 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        if ((int)uVar15 < 1) {
          uVar20 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)this_01->data + uVar5 * 4);
          Mat::channel(&local_88,this_00,(int)uVar5);
          pvVar6 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,(int)uVar5);
          pvVar8 = local_88.data;
          Mat::~Mat(&local_88);
          for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar8 + uVar7 * 4) = *(float *)((long)pvVar6 + uVar7 * 4) - fVar23;
          }
        }
      }
    }
    else {
      uVar19 = this_01->h;
      uVar18 = uVar19 * uVar10;
      if (iVar9 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar20 = 0;
          if (0 < (int)uVar2) {
            uVar20 = (ulong)uVar2;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            iVar9 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar6 = this_01->data;
            Mat::channel(&local_88,this_00,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = pfVar21[uVar7] - fVar23;
              }
              pfVar11 = pfVar11 + lVar12;
              pfVar21 = pfVar21 + lVar12;
            }
          }
        }
        else {
          Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims == 1) {
            Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].w == 1) {
              pvVar8 = this_01->data;
              fVar23 = *this_01[1].data;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar6 + uVar20 * 4) =
                     fVar23 - *(float *)((long)pvVar8 + uVar20 * 4);
              }
            }
            else {
              pvVar8 = this_01->data;
              pvVar13 = this_01[1].data;
              uVar20 = 0;
              if (0 < (int)uVar10) {
                uVar20 = (ulong)uVar10;
              }
              uVar5 = (ulong)uVar19;
              if ((int)uVar19 < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar7 * 4);
                for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
                  *(float *)((long)pvVar6 + uVar14 * 4) =
                       fVar23 - *(float *)((long)pvVar8 + uVar14 * 4);
                }
                pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
                pvVar8 = (void *)((long)pvVar8 + lVar17 * 4);
              }
            }
          }
          else {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar8 = this_01->data;
            pvVar13 = this_01[1].data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar6 + uVar20 * 4) =
                   *(float *)((long)pvVar13 + uVar20 * 4) - *(float *)((long)pvVar8 + uVar20 * 4);
            }
          }
        }
      }
      else if (iVar9 == 3) {
        uVar16 = this_01->c;
        uVar20 = (ulong)uVar16;
        Mat::create(this_02,uVar10,uVar19,uVar16,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        iVar9 = this_01[1].dims;
        if (iVar9 == 1) {
          if (this_01[1].w == 1) {
            fVar23 = *this_00->data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     fVar23 - *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar20 = 0;
            }
            for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
              Mat::channel(&local_88,this_01,(int)uVar5);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              fVar23 = *(float *)((long)this_01[1].data + uVar5 * 4);
              Mat::channel(&local_88,this_02,(int)uVar5);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
                *(float *)((long)pvVar8 + uVar7 * 4) = fVar23 - *(float *)((long)pvVar6 + uVar7 * 4)
                ;
              }
            }
          }
        }
        else if (iVar9 == 3) {
          if (uVar15 == uVar16 && (uVar3 == 1 && uVar2 == 1)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *pvVar13 - *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
          else if ((uVar2 == uVar10) && (uVar15 == 1 && uVar3 == uVar19)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar6 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) - *(float *)((long)pvVar8 + uVar20 * 4);
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) - *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
        }
        else {
          if (iVar9 != 2) {
            return 0;
          }
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_01,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            iVar9 = this_01[1].w;
            sVar4 = this_01[1].elemsize;
            pvVar6 = this_01[1].data;
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = fVar23 - pfVar21[uVar7];
              }
              pfVar11 = pfVar11 + lVar17;
              pfVar21 = pfVar21 + lVar17;
            }
          }
        }
      }
    }
    break;
  case 8:
    uVar10 = this_01->w;
    lVar17 = (long)(int)uVar10;
    sVar4 = this_01->elemsize;
    uVar2 = this_01[1].w;
    lVar12 = (long)(int)uVar2;
    uVar3 = this_01[1].h;
    uVar15 = this_01[1].c;
    iVar9 = this_01->dims;
    if (iVar9 == 1) {
      uVar19 = uVar3 * uVar2;
      iVar9 = this_01[1].dims;
      if (uVar10 == 1) {
        if (iVar9 == 1) {
          Mat::create(this_02,uVar2,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          uVar20 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar20 = 0;
          }
          fVar23 = *this_01->data;
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar6 + uVar5 * 4) =
                 *(float *)((long)pvVar8 + uVar5 * 4) * (1.0 / fVar23);
          }
        }
        else if (iVar9 == 2) {
          Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          pvVar8 = this_01[1].data;
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          fVar23 = *this_01->data;
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) =
                 *(float *)((long)pvVar8 + uVar20 * 4) * (1.0 / fVar23);
          }
        }
        else {
          if (iVar9 != 3) {
            return 0;
          }
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          fVar23 = *this_01->data;
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_00,uVar10);
            pvVar6 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pvVar8 = local_88.data;
            Mat::~Mat(&local_88);
            for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar8 + uVar20 * 4) =
                   *(float *)((long)pvVar6 + uVar20 * 4) * (1.0 / fVar23);
            }
          }
        }
      }
      else if (iVar9 == 1) {
        Mat::create(this_02,uVar10,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w == 1) {
          pvVar8 = this_01->data;
          fVar23 = *this_01[1].data;
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          for (uVar20 = 0; uVar10 != uVar20; uVar20 = uVar20 + 1) {
            *(float *)((long)pvVar6 + uVar20 * 4) = fVar23 / *(float *)((long)pvVar8 + uVar20 * 4);
          }
        }
        else {
          pvVar8 = this_01->data;
          pvVar13 = this_01[1].data;
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          for (uVar5 = 0; uVar20 != uVar5; uVar5 = uVar5 + 1) {
            *(float *)((long)pvVar6 + uVar5 * 4) =
                 *(float *)((long)pvVar13 + uVar5 * 4) / *(float *)((long)pvVar8 + uVar5 * 4);
          }
        }
      }
      else if (iVar9 == 2) {
        Mat::create(this_02,uVar2,uVar3,sVar4,opt->blob_allocator);
        pvVar6 = this_02->data;
        if (pvVar6 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        uVar20 = 0;
        if (0 < (int)uVar2) {
          uVar20 = (ulong)uVar2;
        }
        pvVar8 = this_01->data;
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        pvVar13 = this_01[1].data;
        for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)pvVar8 + uVar5 * 4);
          for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar6 + uVar7 * 4) =
                 *(float *)((long)pvVar13 + uVar7 * 4) * (1.0 / fVar23);
          }
          pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
          pvVar13 = (void *)((long)pvVar13 + lVar12 * 4);
        }
      }
      else {
        if (iVar9 != 3) {
          return 0;
        }
        Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        uVar20 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar20 = 0;
        }
        for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
          fVar23 = *(float *)((long)this_01->data + uVar5 * 4);
          Mat::channel(&local_88,this_00,(int)uVar5);
          pvVar6 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,(int)uVar5);
          pvVar8 = local_88.data;
          Mat::~Mat(&local_88);
          for (uVar7 = 0; uVar19 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar8 + uVar7 * 4) =
                 *(float *)((long)pvVar6 + uVar7 * 4) * (1.0 / fVar23);
          }
        }
      }
    }
    else {
      uVar19 = this_01->h;
      uVar18 = uVar19 * uVar10;
      if (iVar9 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar2,uVar3,uVar15,sVar4,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          uVar20 = 0;
          if (0 < (int)uVar2) {
            uVar20 = (ulong)uVar2;
          }
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
            iVar9 = this_01->w;
            sVar4 = this_01->elemsize;
            pvVar6 = this_01->data;
            Mat::channel(&local_88,this_00,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = pfVar21[uVar7] * (1.0 / fVar23);
              }
              pfVar11 = pfVar11 + lVar12;
              pfVar21 = pfVar21 + lVar12;
            }
          }
        }
        else {
          Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
          pvVar6 = this_02->data;
          if (pvVar6 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if (this_01[1].dims == 1) {
            Mat::create(this_02,uVar10,uVar19,sVar4,opt->blob_allocator);
            pvVar6 = this_02->data;
            if (pvVar6 == (void *)0x0) {
              return -100;
            }
            if ((long)this_02->c * this_02->cstep == 0) {
              return -100;
            }
            if (this_01[1].w == 1) {
              pvVar8 = this_01->data;
              fVar23 = *this_01[1].data;
              if ((int)uVar18 < 1) {
                uVar18 = 0;
              }
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar6 + uVar20 * 4) =
                     fVar23 / *(float *)((long)pvVar8 + uVar20 * 4);
              }
            }
            else {
              pvVar8 = this_01->data;
              pvVar13 = this_01[1].data;
              uVar20 = 0;
              if (0 < (int)uVar10) {
                uVar20 = (ulong)uVar10;
              }
              uVar5 = (ulong)uVar19;
              if ((int)uVar19 < 1) {
                uVar5 = 0;
              }
              for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
                fVar23 = *(float *)((long)pvVar13 + uVar7 * 4);
                for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
                  *(float *)((long)pvVar6 + uVar14 * 4) =
                       fVar23 / *(float *)((long)pvVar8 + uVar14 * 4);
                }
                pvVar6 = (void *)((long)pvVar6 + lVar17 * 4);
                pvVar8 = (void *)((long)pvVar8 + lVar17 * 4);
              }
            }
          }
          else {
            if (this_01[1].dims != 2) {
              return 0;
            }
            pvVar8 = this_01->data;
            pvVar13 = this_01[1].data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
              *(float *)((long)pvVar6 + uVar20 * 4) =
                   *(float *)((long)pvVar13 + uVar20 * 4) / *(float *)((long)pvVar8 + uVar20 * 4);
            }
          }
        }
      }
      else if (iVar9 == 3) {
        uVar16 = this_01->c;
        uVar20 = (ulong)uVar16;
        Mat::create(this_02,uVar10,uVar19,uVar16,sVar4,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        iVar9 = this_01[1].dims;
        if (iVar9 == 1) {
          if (this_01[1].w == 1) {
            fVar23 = *this_00->data;
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     fVar23 / *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar20 = 0;
            }
            for (uVar5 = 0; uVar5 != uVar20; uVar5 = uVar5 + 1) {
              Mat::channel(&local_88,this_01,(int)uVar5);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              fVar23 = *(float *)((long)this_01[1].data + uVar5 * 4);
              Mat::channel(&local_88,this_02,(int)uVar5);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
                *(float *)((long)pvVar8 + uVar7 * 4) = fVar23 / *(float *)((long)pvVar6 + uVar7 * 4)
                ;
              }
            }
          }
        }
        else if (iVar9 == 3) {
          if (uVar15 == uVar16 && (uVar3 == 1 && uVar2 == 1)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar8 + uVar20 * 4) =
                     *pvVar13 / *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
          else if ((uVar2 == uVar10) && (uVar15 == 1 && uVar3 == uVar19)) {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              pvVar6 = this_01[1].data;
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar6 + uVar20 * 4) / *(float *)((long)pvVar8 + uVar20 * 4);
              }
            }
          }
          else {
            if ((int)uVar18 < 1) {
              uVar18 = 0;
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
              Mat::channel(&local_88,this_01,uVar10);
              pvVar6 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_00,uVar10);
              pvVar8 = local_88.data;
              Mat::~Mat(&local_88);
              Mat::channel(&local_88,this_02,uVar10);
              pvVar13 = local_88.data;
              Mat::~Mat(&local_88);
              for (uVar20 = 0; uVar18 != uVar20; uVar20 = uVar20 + 1) {
                *(float *)((long)pvVar13 + uVar20 * 4) =
                     *(float *)((long)pvVar8 + uVar20 * 4) / *(float *)((long)pvVar6 + uVar20 * 4);
              }
            }
          }
        }
        else {
          if (iVar9 != 2) {
            return 0;
          }
          uVar20 = 0;
          if (0 < (int)uVar10) {
            uVar20 = (ulong)uVar10;
          }
          if ((int)uVar19 < 1) {
            uVar19 = 0;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
            Mat::channel(&local_88,this_01,uVar10);
            pfVar21 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            iVar9 = this_01[1].w;
            sVar4 = this_01[1].elemsize;
            pvVar6 = this_01[1].data;
            Mat::channel(&local_88,this_02,uVar10);
            pfVar11 = (float *)local_88.data;
            Mat::~Mat(&local_88);
            for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
              fVar23 = *(float *)((long)pvVar6 + uVar5 * 4 + (long)(int)uVar10 * (long)iVar9 * sVar4
                                 );
              for (uVar7 = 0; uVar20 != uVar7; uVar7 = uVar7 + 1) {
                pfVar11[uVar7] = fVar23 / pfVar21[uVar7];
              }
              pfVar11 = pfVar11 + lVar17;
              pfVar21 = pfVar21 + lVar17;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op< std::plus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op< std::minus<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op< std::multiplies<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op< std::divides<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op< binary_op_max<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op< binary_op_min<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op< binary_op_pow<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op< binary_op_rsub<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op< binary_op_rdiv<float> >(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}